

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.h
# Opt level: O0

void __thiscall
pstack::Dwarf::DIE::DIE
          (DIE *this,shared_ptr<pstack::Dwarf::Unit> *unit,size_t offset_,
          shared_ptr<pstack::Dwarf::DIE::Raw> *raw)

{
  shared_ptr<pstack::Dwarf::DIE::Raw> *raw_local;
  size_t offset__local;
  shared_ptr<pstack::Dwarf::Unit> *unit_local;
  DIE *this_local;
  
  this->offset = offset_;
  std::shared_ptr<pstack::Dwarf::DIE::Raw>::shared_ptr(&this->raw,raw);
  std::shared_ptr<pstack::Dwarf::Unit>::shared_ptr(&this->unit,unit);
  return;
}

Assistant:

DIE(const std::shared_ptr<Unit> &unit, size_t offset_, const std::shared_ptr<Raw> &raw)
        : offset(offset_)
        , raw(raw)
        , unit(unit)
        {}